

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysp_node_free(lysf_ctx *ctx,lysp_node *node)

{
  undefined8 *puVar1;
  ushort uVar2;
  lysp_node *plVar3;
  lysp_restr *plVar4;
  lysp_when *when;
  long lVar5;
  lysp_refine *ref;
  lysp_node *plVar6;
  char *pcVar7;
  lysp_tpdf *plVar8;
  lysp_qname *plVar9;
  ly_ctx *ctx_00;
  long lVar10;
  ulong uVar11;
  lysp_ext_instance *plVar12;
  lysp_restr *restr;
  lysp_ext_instance *plVar13;
  
  plVar4 = lysp_node_musts(node);
  when = lysp_node_when(node);
  lydict_remove(ctx->ctx,node->name);
  lydict_remove(ctx->ctx,node->dsc);
  lydict_remove(ctx->ctx,node->ref);
  plVar9 = node->iffeatures;
  if (plVar9 != (lysp_qname *)0x0) {
    uVar11 = 0xffffffffffffffff;
    lVar5 = 0;
    do {
      uVar11 = uVar11 + 1;
      if (*(ulong *)&plVar9[-1].flags <= uVar11) {
        free(&plVar9[-1].flags);
        break;
      }
      puVar1 = (undefined8 *)((long)&plVar9->str + lVar5);
      lVar5 = lVar5 + 0x18;
      lydict_remove(ctx->ctx,(char *)*puVar1);
      plVar9 = node->iffeatures;
    } while (plVar9 != (lysp_qname *)0x0);
  }
  plVar13 = node->exts;
  if (plVar13 != (lysp_ext_instance *)0x0) {
    plVar12 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar5 = 0;
    do {
      plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
      if (plVar13[-1].exts <= plVar12) {
        free(&plVar13[-1].exts);
        break;
      }
      plVar13 = (lysp_ext_instance *)((long)&plVar13->name + lVar5);
      lVar5 = lVar5 + 0x70;
      lysp_ext_instance_free(ctx,plVar13);
      plVar13 = node->exts;
    } while (plVar13 != (lysp_ext_instance *)0x0);
  }
  if (when != (lysp_when *)0x0) {
    lysp_when_free(ctx,when);
    free(when);
  }
  if (plVar4 != (lysp_restr *)0x0) {
    if (plVar4[-1].exts != (lysp_ext_instance *)0x0) {
      plVar13 = (lysp_ext_instance *)0x0;
      restr = plVar4;
      do {
        lysp_restr_free(ctx,restr);
        plVar13 = (lysp_ext_instance *)((long)&plVar13->name + 1);
        restr = restr + 1;
      } while (plVar13 < plVar4[-1].exts);
    }
    free(&plVar4[-1].exts);
  }
  uVar2 = node->nodetype;
  if (0xff < uVar2) {
    if (uVar2 < 0x1000) {
      if (uVar2 < 0x400) {
        if ((uVar2 == 0x100) || (uVar2 == 0x200)) {
          plVar6 = node[1].parent;
          if (plVar6 != (lysp_node *)0x0) {
            plVar13 = (lysp_ext_instance *)0xffffffffffffffff;
            lVar5 = 0;
            do {
              plVar13 = (lysp_ext_instance *)((long)&plVar13->name + 1);
              if (plVar6[-1].exts <= plVar13) {
                free(&plVar6[-1].exts);
                break;
              }
              plVar8 = (lysp_tpdf *)((long)&plVar6->parent + lVar5);
              lVar5 = lVar5 + 0xb0;
              lysp_tpdf_free(ctx,plVar8);
              plVar6 = node[1].parent;
            } while (plVar6 != (lysp_node *)0x0);
          }
          plVar6 = *(lysp_node **)&node[1].nodetype;
          while (plVar6 != (lysp_node *)0x0) {
            plVar3 = plVar6->next;
            lysp_node_free(ctx,plVar6);
            plVar6 = plVar3;
          }
          if (*(short *)&node[1].name != 0) {
            lysp_node_free(ctx,(lysp_node *)&node[1].next);
          }
          if (*(short *)&node[2].exts != 0) {
            lysp_node_free(ctx,(lysp_node *)&node[2].iffeatures);
          }
          goto LAB_0015c368;
        }
      }
      else {
        if (uVar2 == 0x400) {
          lVar10._0_2_ = node[1].nodetype;
          lVar10._2_2_ = node[1].flags;
          lVar10._4_4_ = *(undefined4 *)&node[1].field_0xc;
          if (lVar10 != 0) {
            uVar11 = 0xffffffffffffffff;
            lVar5 = 0;
            do {
              uVar11 = uVar11 + 1;
              if (*(ulong *)(lVar10 + -8) <= uVar11) {
                free((void *)(lVar10 + -8));
                break;
              }
              plVar8 = (lysp_tpdf *)(lVar10 + lVar5);
              lVar5 = lVar5 + 0xb0;
              lysp_tpdf_free(ctx,plVar8);
              lVar10._0_2_ = node[1].nodetype;
              lVar10._2_2_ = node[1].flags;
              lVar10._4_4_ = *(undefined4 *)&node[1].field_0xc;
            } while (lVar10 != 0);
          }
          plVar6 = node[1].next;
          while (plVar6 != (lysp_node *)0x0) {
            plVar3 = plVar6->next;
            lysp_node_free(ctx,plVar6);
            plVar6 = plVar3;
          }
          plVar6 = (lysp_node *)node[1].name;
          while (plVar6 != (lysp_node *)0x0) {
            plVar3 = plVar6->next;
            lysp_node_free(ctx,plVar6);
            plVar6 = plVar3;
          }
          goto LAB_0015c368;
        }
        if (uVar2 == 0x800) {
          plVar6 = node[1].parent;
          if (plVar6 != (lysp_node *)0x0) {
            plVar13 = (lysp_ext_instance *)0xffffffffffffffff;
            lVar5 = 0;
            do {
              plVar13 = (lysp_ext_instance *)((long)&plVar13->name + 1);
              if (plVar6[-1].exts <= plVar13) {
                free(&plVar6[-1].exts);
                break;
              }
              ref = (lysp_refine *)((long)&plVar6->parent + lVar5);
              lVar5 = lVar5 + 0x50;
              lysp_refine_free(ctx,ref);
              plVar6 = node[1].parent;
            } while (plVar6 != (lysp_node *)0x0);
          }
          plVar6 = *(lysp_node **)&node[1].nodetype;
          while (plVar6 != (lysp_node *)0x0) {
            plVar3 = plVar6->next;
            lysp_node_free(ctx,plVar6);
            plVar6 = plVar3;
          }
          goto LAB_0015c368;
        }
      }
    }
    else if (uVar2 < 0x4000) {
      if ((uVar2 == 0x1000) || (uVar2 == 0x2000)) {
        lVar5._0_2_ = node[1].nodetype;
        lVar5._2_2_ = node[1].flags;
        lVar5._4_4_ = *(undefined4 *)&node[1].field_0xc;
        if (lVar5 != 0) {
          uVar11 = 0xffffffffffffffff;
          lVar10 = 0;
          do {
            uVar11 = uVar11 + 1;
            if (*(ulong *)(lVar5 + -8) <= uVar11) {
              free((void *)(lVar5 + -8));
              break;
            }
            plVar8 = (lysp_tpdf *)(lVar5 + lVar10);
            lVar10 = lVar10 + 0xb0;
            lysp_tpdf_free(ctx,plVar8);
            lVar5._0_2_ = node[1].nodetype;
            lVar5._2_2_ = node[1].flags;
            lVar5._4_4_ = *(undefined4 *)&node[1].field_0xc;
          } while (lVar5 != 0);
        }
        plVar6 = node[1].next;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        plVar6 = (lysp_node *)node[1].name;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        return;
      }
    }
    else {
      if (uVar2 == 0x8000) {
        plVar6 = node[1].parent;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        plVar6 = node[1].next;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        plVar6 = (lysp_node *)node[1].name;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        goto LAB_0015c368;
      }
      if (uVar2 == 0x4000) {
        plVar6 = node[1].parent;
        if (plVar6 != (lysp_node *)0x0) {
          plVar13 = (lysp_ext_instance *)0xffffffffffffffff;
          lVar5 = 0;
          do {
            plVar13 = (lysp_ext_instance *)((long)&plVar13->name + 1);
            if (plVar6[-1].exts <= plVar13) {
              free(&plVar6[-1].exts);
              break;
            }
            plVar8 = (lysp_tpdf *)((long)&plVar6->parent + lVar5);
            lVar5 = lVar5 + 0xb0;
            lysp_tpdf_free(ctx,plVar8);
            plVar6 = node[1].parent;
          } while (plVar6 != (lysp_node *)0x0);
        }
        plVar6 = *(lysp_node **)&node[1].nodetype;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        plVar6 = node[1].next;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        plVar6 = (lysp_node *)node[1].name;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        plVar6 = (lysp_node *)node[1].dsc;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        goto LAB_0015c368;
      }
    }
switchD_0015bc56_caseD_3:
    ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
           ,0x25f);
    goto LAB_0015c368;
  }
  if (0xf < uVar2) {
    if (uVar2 < 0x60) {
      if (uVar2 == 0x10) {
        lydict_remove(ctx->ctx,(char *)node[1].next);
        pcVar7 = node[1].name;
        if (pcVar7 != (char *)0x0) {
          uVar11 = 0xffffffffffffffff;
          lVar5 = 0;
          do {
            uVar11 = uVar11 + 1;
            if (*(ulong *)(pcVar7 + -8) <= uVar11) {
              free(pcVar7 + -8);
              break;
            }
            plVar8 = (lysp_tpdf *)(pcVar7 + lVar5);
            lVar5 = lVar5 + 0xb0;
            lysp_tpdf_free(ctx,plVar8);
            pcVar7 = node[1].name;
          } while (pcVar7 != (char *)0x0);
        }
        plVar6 = (lysp_node *)node[1].dsc;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        plVar6 = (lysp_node *)node[1].ref;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        plVar6 = (lysp_node *)node[1].iffeatures;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        plVar13 = node[1].exts;
        while (plVar13 != (lysp_ext_instance *)0x0) {
          plVar12 = *(lysp_ext_instance **)&plVar13->format;
          lysp_node_free(ctx,(lysp_node *)plVar13);
          plVar13 = plVar12;
        }
        plVar6 = node[2].parent;
        if (plVar6 != (lysp_node *)0x0) {
          plVar13 = (lysp_ext_instance *)0xffffffffffffffff;
          lVar5 = 0;
          do {
            plVar13 = (lysp_ext_instance *)((long)&plVar13->name + 1);
            if (plVar6[-1].exts <= plVar13) goto LAB_0015c317;
            puVar1 = (undefined8 *)((long)&plVar6->parent + lVar5);
            lVar5 = lVar5 + 0x18;
            lydict_remove(ctx->ctx,(char *)*puVar1);
            plVar6 = node[2].parent;
          } while (plVar6 != (lysp_node *)0x0);
        }
        goto LAB_0015c368;
      }
      if (uVar2 == 0x20) goto LAB_0015c368;
    }
    else {
      if (uVar2 == 0x60) goto LAB_0015c368;
      if (uVar2 == 0x80) {
        plVar6 = node[1].parent;
        while (plVar6 != (lysp_node *)0x0) {
          plVar3 = plVar6->next;
          lysp_node_free(ctx,plVar6);
          plVar6 = plVar3;
        }
        goto LAB_0015c368;
      }
    }
    goto switchD_0015bc56_caseD_3;
  }
  switch(uVar2) {
  case 1:
    lydict_remove(ctx->ctx,(char *)node[1].next);
    pcVar7 = node[1].name;
    if (pcVar7 != (char *)0x0) {
      uVar11 = 0xffffffffffffffff;
      lVar5 = 0;
      do {
        uVar11 = uVar11 + 1;
        if (*(ulong *)(pcVar7 + -8) <= uVar11) {
          free(pcVar7 + -8);
          break;
        }
        plVar8 = (lysp_tpdf *)(pcVar7 + lVar5);
        lVar5 = lVar5 + 0xb0;
        lysp_tpdf_free(ctx,plVar8);
        pcVar7 = node[1].name;
      } while (pcVar7 != (char *)0x0);
    }
    plVar6 = (lysp_node *)node[1].dsc;
    while (plVar6 != (lysp_node *)0x0) {
      plVar3 = plVar6->next;
      lysp_node_free(ctx,plVar6);
      plVar6 = plVar3;
    }
    plVar6 = (lysp_node *)node[1].ref;
    while (plVar6 != (lysp_node *)0x0) {
      plVar3 = plVar6->next;
      lysp_node_free(ctx,plVar6);
      plVar6 = plVar3;
    }
    plVar6 = (lysp_node *)node[1].iffeatures;
    while (plVar6 != (lysp_node *)0x0) {
      plVar3 = plVar6->next;
      lysp_node_free(ctx,plVar6);
      plVar6 = plVar3;
    }
    plVar13 = node[1].exts;
    while (plVar13 != (lysp_ext_instance *)0x0) {
      plVar12 = *(lysp_ext_instance **)&plVar13->format;
      lysp_node_free(ctx,(lysp_node *)plVar13);
      plVar13 = plVar12;
    }
    goto LAB_0015c368;
  case 2:
    plVar6 = node[1].parent;
    while (plVar6 != (lysp_node *)0x0) {
      plVar3 = plVar6->next;
      lysp_node_free(ctx,plVar6);
      plVar6 = plVar3;
    }
    ctx_00 = ctx->ctx;
    plVar6 = node[1].next;
    break;
  default:
    goto switchD_0015bc56_caseD_3;
  case 4:
    lysp_type_free(ctx,(lysp_type *)&node[1].next);
    lydict_remove(ctx->ctx,(char *)node[2].exts);
    ctx_00 = ctx->ctx;
    plVar6 = node[3].parent;
    break;
  case 8:
    lysp_type_free(ctx,(lysp_type *)&node[1].next);
    lydict_remove(ctx->ctx,(char *)node[2].exts);
    plVar6 = node[3].parent;
    if (plVar6 != (lysp_node *)0x0) {
      plVar13 = (lysp_ext_instance *)0xffffffffffffffff;
      lVar5 = 0;
      do {
        plVar13 = (lysp_ext_instance *)((long)&plVar13->name + 1);
        if (plVar6[-1].exts <= plVar13) goto LAB_0015c317;
        puVar1 = (undefined8 *)((long)&plVar6->parent + lVar5);
        lVar5 = lVar5 + 0x18;
        lydict_remove(ctx->ctx,(char *)*puVar1);
        plVar6 = node[3].parent;
      } while (plVar6 != (lysp_node *)0x0);
    }
    goto LAB_0015c368;
  }
  lydict_remove(ctx_00,(char *)plVar6);
LAB_0015c368:
  free(node);
  return;
LAB_0015c317:
  free(&plVar6[-1].exts);
  goto LAB_0015c368;
}

Assistant:

void
lysp_node_free(struct lysf_ctx *ctx, struct lysp_node *node)
{
    struct lysp_node *child, *next;
    struct lysp_node_container *cont;
    struct lysp_node_leaf *leaf;
    struct lysp_node_leaflist *llist;
    struct lysp_node_list *list;
    struct lysp_node_choice *choice;
    struct lysp_node_case *cas;
    struct lysp_node_uses *uses;
    struct lysp_node_action *act;
    struct lysp_node_action_inout *inout;
    struct lysp_node_notif *notif;
    struct lysp_restr *musts = lysp_node_musts(node);
    struct lysp_when *when = lysp_node_when(node);

    lydict_remove(ctx->ctx, node->name);
    lydict_remove(ctx->ctx, node->dsc);
    lydict_remove(ctx->ctx, node->ref);
    FREE_ARRAY(ctx->ctx, node->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, node->exts, lysp_ext_instance_free);

    FREE_MEMBER(ctx, when, lysp_when_free);
    FREE_ARRAY(ctx, musts, lysp_restr_free);

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = (struct lysp_node_container *)node;

        lydict_remove(ctx->ctx, cont->presence);
        FREE_ARRAY(ctx, cont->typedefs, lysp_tpdf_free);
        if (cont->groupings) {
            LY_LIST_FOR_SAFE(&cont->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(cont->child, next, child) {
            lysp_node_free(ctx, child);
        }
        if (cont->actions) {
            LY_LIST_FOR_SAFE(&cont->actions->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (cont->notifs) {
            LY_LIST_FOR_SAFE(&cont->notifs->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        break;
    case LYS_LEAF:
        leaf = (struct lysp_node_leaf *)node;

        lysp_type_free(ctx, &leaf->type);
        lydict_remove(ctx->ctx, leaf->units);
        lydict_remove(ctx->ctx, leaf->dflt.str);
        break;
    case LYS_LEAFLIST:
        llist = (struct lysp_node_leaflist *)node;

        lysp_type_free(ctx, &llist->type);
        lydict_remove(ctx->ctx, llist->units);
        FREE_ARRAY(ctx->ctx, llist->dflts, lysp_qname_free);
        break;
    case LYS_LIST:
        list = (struct lysp_node_list *)node;

        lydict_remove(ctx->ctx, list->key);
        FREE_ARRAY(ctx, list->typedefs, lysp_tpdf_free);
        if (list->groupings) {
            LY_LIST_FOR_SAFE(&list->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(list->child, next, child) {
            lysp_node_free(ctx, child);
        }
        if (list->actions) {
            LY_LIST_FOR_SAFE(&list->actions->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (list->notifs) {
            LY_LIST_FOR_SAFE(&list->notifs->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        FREE_ARRAY(ctx->ctx, list->uniques, lysp_qname_free);
        break;
    case LYS_CHOICE:
        choice = (struct lysp_node_choice *)node;

        LY_LIST_FOR_SAFE(choice->child, next, child) {
            lysp_node_free(ctx, child);
        }
        lydict_remove(ctx->ctx, choice->dflt.str);
        break;
    case LYS_CASE:
        cas = (struct lysp_node_case *)node;

        LY_LIST_FOR_SAFE(cas->child, next, child) {
            lysp_node_free(ctx, child);
        }
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        /* nothing special to do */
        break;
    case LYS_USES:
        uses = (struct lysp_node_uses *)node;

        FREE_ARRAY(ctx, uses->refines, lysp_refine_free);
        if (uses->augments) {
            LY_LIST_FOR_SAFE(&uses->augments->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        act = (struct lysp_node_action *)node;

        FREE_ARRAY(ctx, act->typedefs, lysp_tpdf_free);
        if (act->groupings) {
            LY_LIST_FOR_SAFE(&act->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (act->input.nodetype) {
            lysp_node_free(ctx, &act->input.node);
        }
        if (act->output.nodetype) {
            lysp_node_free(ctx, &act->output.node);
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        inout = (struct lysp_node_action_inout *)node;

        FREE_ARRAY(ctx, inout->typedefs, lysp_tpdf_free);
        if (inout->groupings) {
            LY_LIST_FOR_SAFE(&inout->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(inout->child, next, child) {
            lysp_node_free(ctx, child);
        }
        /* do not free the node, it is never standalone but part of the action node */
        return;
    case LYS_NOTIF:
        notif = (struct lysp_node_notif *)node;

        FREE_ARRAY(ctx, notif->typedefs, lysp_tpdf_free);
        if (notif->groupings) {
            LY_LIST_FOR_SAFE(&notif->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(notif->child, next, child) {
            lysp_node_free(ctx, child);
        }
        break;
    case LYS_GROUPING:
        lysp_grp_free(ctx, (struct lysp_node_grp *)node);
        break;
    case LYS_AUGMENT:
        lysp_augment_free(ctx, ((struct lysp_node_augment *)node));
        break;
    default:
        LOGINT(ctx->ctx);
    }

    free(node);
}